

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

char * __thiscall
icu_63::RuleBasedCollator::internalGetLocaleID
          (RuleBasedCollator *this,ULocDataLocaleType type,UErrorCode *errorCode)

{
  UBool UVar1;
  RuleBasedCollator *local_58;
  Locale *local_50;
  char *id;
  Locale *result;
  UErrorCode *errorCode_local;
  ULocDataLocaleType type_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (type == ULOC_ACTUAL_LOCALE) {
      if (this->actualLocaleIsSameAsValid == '\0') {
        local_50 = &this->tailoring->actualLocale;
      }
      else {
        local_50 = &this->validLocale;
      }
      id = (char *)local_50;
    }
    else {
      if (type != ULOC_VALID_LOCALE) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return (char *)0x0;
      }
      id = (char *)&this->validLocale;
    }
    UVar1 = Locale::isBogus((Locale *)id);
    if (UVar1 == '\0') {
      local_58 = (RuleBasedCollator *)Locale::getName((Locale *)id);
      if (*(char *)&(local_58->super_Collator).super_UObject._vptr_UObject == '\0') {
        local_58 = (RuleBasedCollator *)0x4d487f;
      }
      this_local = local_58;
    }
    else {
      this_local = (RuleBasedCollator *)0x0;
    }
  }
  else {
    this_local = (RuleBasedCollator *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char *
RuleBasedCollator::internalGetLocaleID(ULocDataLocaleType type, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const Locale *result;
    switch(type) {
    case ULOC_ACTUAL_LOCALE:
        result = actualLocaleIsSameAsValid ? &validLocale : &tailoring->actualLocale;
        break;
    case ULOC_VALID_LOCALE:
        result = &validLocale;
        break;
    case ULOC_REQUESTED_LOCALE:
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if(result->isBogus()) { return NULL; }
    const char *id = result->getName();
    return id[0] == 0 ? "root" : id;
}